

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::OperatorShaderEvaluator::evaluate
          (OperatorShaderEvaluator *this,ShaderEvalContext *ctx)

{
  Vector<float,_4> local_38;
  undefined8 local_28;
  undefined8 local_20;
  ShaderEvalContext *local_18;
  ShaderEvalContext *ctx_local;
  OperatorShaderEvaluator *this_local;
  
  local_18 = ctx;
  ctx_local = (ShaderEvalContext *)this;
  (*this->m_evalFunc)(ctx);
  tcu::operator*((tcu *)&local_38,&local_18->color,this->m_scale);
  tcu::operator+((tcu *)&local_28,&local_38,this->m_bias);
  *(undefined8 *)(local_18->color).m_data = local_28;
  *(undefined8 *)((local_18->color).m_data + 2) = local_20;
  return;
}

Assistant:

virtual void evaluate (ShaderEvalContext& ctx)
	{
		m_evalFunc(ctx);
		ctx.color = ctx.color * m_scale + m_bias;
	}